

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O2

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  byte *pbVar1;
  uint64_t uVar2;
  GCstr *key;
  cTValue *pcVar3;
  TValue *pTVar4;
  VMEvent key_00;
  GCtab *t;
  
  uVar2 = (L->glref).ptr64;
  key = lj_str_new(L,"_VMEVENTS",9);
  pcVar3 = lj_tab_getstr((GCtab *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff),key);
  if ((pcVar3->field_4).it >> 0xf == 0x1fff4) {
    key_00 = ev & 0xfffffff8;
    t = (GCtab *)((ulong)pcVar3->field_4 & 0x7fffffffffff);
    if (key_00 < t->asize) {
      pcVar3 = (cTValue *)((long)(int)key_00 * 8 + (t->array).ptr64);
    }
    else {
      pcVar3 = lj_tab_getinth(t,key_00);
    }
    if ((pcVar3 != (cTValue *)0x0) && ((pcVar3->u64 & 0xffff800000000000) == 0xfffb800000000000)) {
      pTVar4 = L->top;
      if ((long)((L->maxstack).ptr64 - (long)pTVar4) < 0xa1) {
        lj_state_growstack(L,0x14);
        pTVar4 = L->top;
      }
      L->top = pTVar4 + 1;
      pTVar4->u64 = pcVar3->u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->u64 = 0xffffffffffffffff;
      return (long)L->top - (L->stack).ptr64;
    }
  }
  pbVar1 = (byte *)(uVar2 + 0x93);
  *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)ev & 7));
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      if (LJ_FR2) setnilV(L->top++);
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}